

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

int INT_EVsubmit_or_wait
              (EVsource source,void *data,attr_list attrs,EVSubmitCallbackFunc cb,void *user_data)

{
  int iVar1;
  stone_type p_Var2;
  
  p_Var2 = stone_struct(source->cm->evp,source->local_stone_id);
  if (p_Var2 == (stone_type)0x0) {
    iVar1 = -1;
  }
  else if (p_Var2->is_stalled == 0) {
    INT_EVsubmit(source,data,attrs);
    iVar1 = 1;
  }
  else {
    register_backpressure_callback(source->cm,source->local_stone_id,cb,user_data);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
INT_EVsubmit_or_wait(EVsource source, void *data, attr_list attrs,
                    EVSubmitCallbackFunc cb, void *user_data) {
    CManager cm = source->cm;
    stone_type stone;

    stone = stone_struct(cm->evp, source->local_stone_id);
    if (!stone) return -1;

    if (stone->is_stalled) {
        register_backpressure_callback(source->cm, source->local_stone_id, cb, user_data);
        return 0;
    } else {
        INT_EVsubmit(source, data, attrs);
        return 1;
    }
}